

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

Norm2AllModes * icu_63::Norm2AllModes::createNFCInstance(UErrorCode *errorCode)

{
  UBool UVar1;
  Normalizer2Impl *this;
  size_t in_RSI;
  Normalizer2Impl *local_48;
  Normalizer2Impl *impl;
  UErrorCode *errorCode_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this = (Normalizer2Impl *)UMemory::operator_new((UMemory *)0x50,in_RSI);
    local_48 = (Normalizer2Impl *)0x0;
    if (this != (Normalizer2Impl *)0x0) {
      Normalizer2Impl::Normalizer2Impl(this);
      local_48 = this;
    }
    if (local_48 == (Normalizer2Impl *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      errorCode_local = (UErrorCode *)0x0;
    }
    else {
      Normalizer2Impl::init(local_48,(EVP_PKEY_CTX *)norm2_nfc_data_indexes);
      errorCode_local = (UErrorCode *)createInstance(local_48,errorCode);
    }
  }
  else {
    errorCode_local = (UErrorCode *)0x0;
  }
  return (Norm2AllModes *)errorCode_local;
}

Assistant:

Norm2AllModes *
Norm2AllModes::createNFCInstance(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    Normalizer2Impl *impl=new Normalizer2Impl;
    if(impl==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    impl->init(norm2_nfc_data_indexes, &norm2_nfc_data_trie,
               norm2_nfc_data_extraData, norm2_nfc_data_smallFCD);
    return createInstance(impl, errorCode);
}